

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::multisample::
MSCase<vkt::pipeline::multisample::MSCaseCentroidQualifierInsidePrimitive>::initPrograms
          (MSCase<vkt::pipeline::multisample::MSCaseCentroidQualifierInsidePrimitive> *this,
          SourceCollections *programCollection)

{
  ostream *poVar1;
  ProgramSources *pPVar2;
  ostringstream fs;
  ostringstream vs;
  allocator<char> local_369;
  string local_368;
  undefined1 local_348 [40];
  string local_320;
  undefined1 local_300 [376];
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"#version 440\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in vec4 vs_in_position_ndc;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 1) in vec3 vs_in_barCoord;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out vec3 vs_out_barCoord;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"out gl_PerVertex {\n");
  poVar1 = std::operator<<(poVar1,"\tvec4  gl_Position;\n");
  poVar1 = std::operator<<(poVar1,"};\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\tgl_Position\t\t= vs_in_position_ndc;\n");
  poVar1 = std::operator<<(poVar1,"\tvs_out_barCoord = vs_in_barCoord;\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_348,"vertex_shader",(allocator<char> *)&local_320);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)local_348);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_300,&local_368);
  glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_300);
  std::__cxx11::string::~string((string *)(local_300 + 8));
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)local_348);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
  poVar1 = std::operator<<((ostream *)local_300,"#version 440\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) centroid in vec3 fs_in_barCoord;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out vec4 fs_out_color;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,
                           "\tif( all(greaterThanEqual(fs_in_barCoord, vec3(0.0))) && all(lessThanEqual(fs_in_barCoord, vec3(1.0))) )\n"
                          );
  poVar1 = std::operator<<(poVar1,"\t\t\tfs_out_color = vec4(0.0, 1.0, 0.0, 1.0);\n");
  poVar1 = std::operator<<(poVar1,"\telse\n");
  poVar1 = std::operator<<(poVar1,"\t\t\tfs_out_color = vec4(1.0, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,"fragment_shader",&local_369);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_368);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_348,&local_320);
  glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_348);
  std::__cxx11::string::~string((string *)(local_348 + 8));
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void MSCase<MSCaseCentroidQualifierInsidePrimitive>::initPrograms (vk::SourceCollections& programCollection) const
{
	// Create vertex shader
	std::ostringstream vs;

	vs << "#version 440\n"
		<< "layout(location = 0) in vec4 vs_in_position_ndc;\n"
		<< "layout(location = 1) in vec3 vs_in_barCoord;\n"
		<< "\n"
		<< "layout(location = 0) out vec3 vs_out_barCoord;\n"
		<< "\n"
		<< "out gl_PerVertex {\n"
		<< "	vec4  gl_Position;\n"
		<< "};\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position		= vs_in_position_ndc;\n"
		<< "	vs_out_barCoord = vs_in_barCoord;\n"
		<< "}\n";

	programCollection.glslSources.add("vertex_shader") << glu::VertexSource(vs.str());

	// Create fragment shader
	std::ostringstream fs;

	fs << "#version 440\n"
		<< "layout(location = 0) centroid in vec3 fs_in_barCoord;\n"
		<< "\n"
		<< "layout(location = 0) out vec4 fs_out_color;\n"
		<< "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	if( all(greaterThanEqual(fs_in_barCoord, vec3(0.0))) && all(lessThanEqual(fs_in_barCoord, vec3(1.0))) )\n"
		<< "			fs_out_color = vec4(0.0, 1.0, 0.0, 1.0);\n"
		<< "	else\n"
		<< "			fs_out_color = vec4(1.0, 0.0, 0.0, 1.0);\n"
		<< "}\n";

	programCollection.glslSources.add("fragment_shader") << glu::FragmentSource(fs.str());
}